

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O0

void Gia_ManCofExtendSolver(Ccf_Man_t *p)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar1;
  int fCompl0;
  int fCompl1;
  Gia_Obj_t *pObj_00;
  int local_1c;
  int i;
  Gia_Obj_t *pObj;
  Ccf_Man_t *p_local;
  
  local_1c = sat_solver_nvars(p->pSat);
  while( true ) {
    iVar2 = Gia_ManObjNum(p->pFrames);
    if (iVar2 <= local_1c) break;
    pObj_00 = Gia_ManObj(p->pFrames,local_1c);
    iVar2 = Gia_ObjIsAnd(pObj_00);
    if (iVar2 != 0) {
      psVar1 = p->pSat;
      iVar2 = Gia_ObjFaninId0(pObj_00,local_1c);
      iVar1 = Gia_ObjFaninId1(pObj_00,local_1c);
      fCompl0 = Gia_ObjFaninC0(pObj_00);
      fCompl1 = Gia_ObjFaninC1(pObj_00);
      sat_solver_add_and(psVar1,local_1c,iVar2,iVar1,fCompl0,fCompl1,0);
    }
    local_1c = local_1c + 1;
  }
  psVar1 = p->pSat;
  iVar2 = Gia_ManObjNum(p->pFrames);
  sat_solver_setnvars(psVar1,iVar2);
  return;
}

Assistant:

void Gia_ManCofExtendSolver( Ccf_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    // add SAT clauses
    for ( i = sat_solver_nvars(p->pSat); i < Gia_ManObjNum(p->pFrames); i++ )
    {
        pObj = Gia_ManObj( p->pFrames, i );
        if ( Gia_ObjIsAnd(pObj) )
            sat_solver_add_and( p->pSat, i, 
                Gia_ObjFaninId0(pObj, i), 
                Gia_ObjFaninId1(pObj, i), 
                Gia_ObjFaninC0(pObj), 
                Gia_ObjFaninC1(pObj), 0 ); 
    }
    sat_solver_setnvars( p->pSat, Gia_ManObjNum(p->pFrames) );
}